

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::slashMod(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  ldiv_t lVar3;
  allocator<char> local_49;
  string local_48;
  
  requireDStackDepth(this,2,"/MOD");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  if (uVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"/MOD: zero divisor",&local_49);
    throwCppExceptionMessage(this,&local_48,errorDivisionByZero);
    std::__cxx11::string::~string((string *)&local_48);
  }
  lVar3 = ldiv((long)(int)uVar2,(long)(int)uVar1);
  ForthStack<unsigned_int>::setTop(this_00,1,(uint)lVar3.rem);
  ForthStack<unsigned_int>::setTop(this_00,(uint)lVar3.quot);
  return;
}

Assistant:

void slashMod() {
			REQUIRE_DSTACK_DEPTH(2, "/MOD");
			auto n2 = static_cast<SCell>(dStack.getTop());
			auto n1 = static_cast<SCell>(dStack.getTop(1));
			RUNTIME_ERROR_IF(n2 == 0, "/MOD: zero divisor", errorDivisionByZero);
			auto result = std::ldiv(n1, n2);
			dStack.setTop(1, static_cast<Cell>(result.rem));
			dStack.setTop(static_cast<Cell>(result.quot));
		}